

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FusionEKF.cpp
# Opt level: O2

void __thiscall FusionEKF::~FusionEKF(FusionEKF *this)

{
  this->_vptr_FusionEKF = (_func_int **)&PTR__FusionEKF_0011cd00;
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->Hj_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->H_laser_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->R_radar_);
  Eigen::DenseStorage<double,_-1,_-1,_-1,_0>::~DenseStorage
            ((DenseStorage<double,__1,__1,__1,_0> *)&this->R_laser_);
  Tools::~Tools(&this->tools);
  KalmanFilter::~KalmanFilter(&this->ekf_);
  return;
}

Assistant:

FusionEKF::~FusionEKF() {}